

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

void Kit_DsdExpandCollectXor_rec(Kit_DsdNtk_t *p,uint iLit,uint *piLitsNew,int *nLitsNew)

{
  int iVar1;
  uint uVar2;
  Kit_DsdObj_t *pKVar3;
  uint local_34;
  uint iLitFanin;
  uint i;
  Kit_DsdObj_t *pObj;
  int *nLitsNew_local;
  uint *piLitsNew_local;
  uint iLit_local;
  Kit_DsdNtk_t *p_local;
  
  iVar1 = Abc_Lit2Var(iLit);
  pKVar3 = Kit_DsdNtkObj(p,iVar1);
  iVar1 = Abc_Lit2Var(iLit);
  if ((iVar1 < (int)(uint)p->nVars) || (((uint)*pKVar3 >> 6 & 7) != 4)) {
    iVar1 = *nLitsNew;
    *nLitsNew = iVar1 + 1;
    piLitsNew[iVar1] = iLit;
  }
  else {
    iVar1 = Abc_Lit2Var(iLit);
    pKVar3 = Kit_DsdNtkObj(p,iVar1);
    for (local_34 = 0; local_34 < (uint)*pKVar3 >> 0x1a; local_34 = local_34 + 1) {
      Kit_DsdExpandCollectXor_rec
                (p,(uint)*(ushort *)(&pKVar3[1].field_0x0 + (ulong)local_34 * 2),piLitsNew,nLitsNew)
      ;
    }
    iVar1 = Abc_LitIsCompl(iLit);
    if (iVar1 != 0) {
      uVar2 = Abc_LitNot(*piLitsNew);
      *piLitsNew = uVar2;
    }
  }
  return;
}

Assistant:

void Kit_DsdExpandCollectXor_rec( Kit_DsdNtk_t * p, unsigned iLit, unsigned * piLitsNew, int * nLitsNew )
{
    Kit_DsdObj_t * pObj;
    unsigned i, iLitFanin;
    // check the end of the supergate
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    if ( Abc_Lit2Var(iLit) < p->nVars || pObj->Type != KIT_DSD_XOR )
    {
        piLitsNew[(*nLitsNew)++] = iLit;
        return;
    }
    // iterate through the fanins
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    Kit_DsdObjForEachFanin( p, pObj, iLitFanin, i )
        Kit_DsdExpandCollectXor_rec( p, iLitFanin, piLitsNew, nLitsNew );
    // if the literal was complemented, pass the complemented attribute somewhere
    if ( Abc_LitIsCompl(iLit) )
        piLitsNew[0] = Abc_LitNot( piLitsNew[0] );
}